

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

CURLcode Curl_dynhds_h1_dprint(dynhds *dynhds,dynbuf *dbuf)

{
  ulong local_30;
  size_t i;
  CURLcode result;
  dynbuf *dbuf_local;
  dynhds *dynhds_local;
  
  i._4_4_ = CURLE_OK;
  if (dynhds->hds_len == 0) {
    dynhds_local._4_4_ = CURLE_OK;
  }
  else {
    local_30 = 0;
    while ((local_30 < dynhds->hds_len &&
           (i._4_4_ = Curl_dyn_addf(dbuf,"%.*s: %.*s\r\n",
                                    dynhds->hds[local_30]->namelen & 0xffffffff,
                                    dynhds->hds[local_30]->name,
                                    dynhds->hds[local_30]->valuelen & 0xffffffff,
                                    dynhds->hds[local_30]->value), i._4_4_ == CURLE_OK))) {
      local_30 = local_30 + 1;
    }
    dynhds_local._4_4_ = i._4_4_;
  }
  return dynhds_local._4_4_;
}

Assistant:

CURLcode Curl_dynhds_h1_dprint(struct dynhds *dynhds, struct dynbuf *dbuf)
{
  CURLcode result = CURLE_OK;
  size_t i;

  if(!dynhds->hds_len)
    return result;

  for(i = 0; i < dynhds->hds_len; ++i) {
    result = Curl_dyn_addf(dbuf, "%.*s: %.*s\r\n",
               (int)dynhds->hds[i]->namelen, dynhds->hds[i]->name,
               (int)dynhds->hds[i]->valuelen, dynhds->hds[i]->value);
    if(result)
      break;
  }

  return result;
}